

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhr_request_method_common.c
# Opt level: O2

size_t nhr_request_map_strings_length(_nhr_map_node *map,size_t iteration_increment)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  
  sVar3 = 0;
  for (; map != (_nhr_map_node *)0x0; map = map->next) {
    sVar1 = strlen(map->key);
    sVar2 = strlen((map->value).string);
    sVar3 = sVar3 + iteration_increment + sVar1 + sVar2;
  }
  return sVar3;
}

Assistant:

size_t nhr_request_map_strings_length(_nhr_map_node * map, const size_t iteration_increment) {
	size_t len = 0;
	_nhr_map_node *cur = map;
	while (cur) {
		len += strlen(cur->key) + strlen(cur->value.string) + iteration_increment;
		cur = cur->next;
	}
	return len;
}